

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanomsg_source.cc
# Opt level: O0

int Nanomsg::open(char *__file,int __oflag,...)

{
  ostream *poVar1;
  char *pcVar2;
  runtime_error *prVar3;
  stringstream ss_3;
  stringstream ss_2;
  int size;
  stringstream ss_1;
  char *url;
  stringstream ss;
  int fd;
  int rv;
  int in_stack_fffffffffffff85c;
  int in_stack_fffffffffffff860;
  char *in_stack_fffffffffffff868;
  int in_stack_fffffffffffff870;
  int *in_stack_fffffffffffff878;
  undefined4 in_stack_fffffffffffff880;
  undefined4 in_stack_fffffffffffff884;
  undefined8 in_stack_fffffffffffff888;
  int in_stack_fffffffffffff890;
  string local_6e8 [32];
  stringstream local_6c8 [16];
  ostream local_6b8 [383];
  undefined1 local_539;
  string local_538 [32];
  stringstream local_518 [16];
  ostream local_508 [376];
  int local_390;
  undefined1 local_389;
  string local_388 [32];
  stringstream local_368 [16];
  ostream local_358 [376];
  char *local_1e0;
  undefined1 local_1d1;
  string local_1d0 [48];
  stringstream local_1a0 [16];
  ostream local_190 [376];
  int local_18;
  int local_14;
  long local_10;
  char *local_8;
  
  local_10 = ___oflag;
  local_8 = __file;
  local_18 = nn_socket(in_stack_fffffffffffff860,in_stack_fffffffffffff85c);
  if (local_18 < 0) {
    std::__cxx11::stringstream::stringstream(local_1a0);
    poVar1 = std::operator<<(local_190,"nn_socket: ");
    nn_errno();
    pcVar2 = nn_strerror(0);
    std::operator<<(poVar1,pcVar2);
    local_1d1 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    std::runtime_error::runtime_error(prVar3,local_1d0);
    local_1d1 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_1e0 = (char *)std::__cxx11::string::c_str();
  local_14 = nn_connect(in_stack_fffffffffffff870,in_stack_fffffffffffff868);
  if (-1 < local_14) {
    local_390 = (int)*(undefined8 *)(local_10 + 0xd8);
    if ((0 < local_390) &&
       (local_14 = nn_setsockopt(in_stack_fffffffffffff890,
                                 (int)((ulong)in_stack_fffffffffffff888 >> 0x20),
                                 (int)in_stack_fffffffffffff888,
                                 (void *)CONCAT44(in_stack_fffffffffffff884,
                                                  in_stack_fffffffffffff880),
                                 (size_t)in_stack_fffffffffffff878), local_14 < 0)) {
      nn_close(in_stack_fffffffffffff870);
      std::__cxx11::stringstream::stringstream(local_518);
      poVar1 = std::operator<<(local_508,"nn_setsockopt: ");
      nn_errno();
      pcVar2 = nn_strerror(0);
      std::operator<<(poVar1,pcVar2);
      local_539 = 1;
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringstream::str();
      std::runtime_error::runtime_error(prVar3,local_538);
      local_539 = 0;
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_14 = nn_setsockopt(in_stack_fffffffffffff890,
                             (int)((ulong)in_stack_fffffffffffff888 >> 0x20),
                             (int)in_stack_fffffffffffff888,
                             (void *)CONCAT44(in_stack_fffffffffffff884,in_stack_fffffffffffff880),
                             (size_t)in_stack_fffffffffffff878);
    if (-1 < local_14) {
      std::make_unique<Nanomsg,int&>(in_stack_fffffffffffff878);
      return (int)__file;
    }
    nn_close(in_stack_fffffffffffff870);
    std::__cxx11::stringstream::stringstream(local_6c8);
    poVar1 = std::operator<<(local_6b8,"nn_setsockopt: ");
    nn_errno();
    pcVar2 = nn_strerror(0);
    std::operator<<(poVar1,pcVar2);
    poVar1 = std::operator<<(local_6b8," (");
    poVar1 = std::operator<<(poVar1,local_1e0);
    std::operator<<(poVar1,")");
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    std::runtime_error::runtime_error(prVar3,local_6e8);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  nn_close(in_stack_fffffffffffff870);
  std::__cxx11::stringstream::stringstream(local_368);
  poVar1 = std::operator<<(local_358,"nn_connect: ");
  nn_errno();
  pcVar2 = nn_strerror(0);
  std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(local_358," (");
  poVar1 = std::operator<<(poVar1,local_1e0);
  std::operator<<(poVar1,")");
  local_389 = 1;
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringstream::str();
  std::runtime_error::runtime_error(prVar3,local_388);
  local_389 = 0;
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::unique_ptr<Nanomsg> Nanomsg::open(const Config& config) {
  int rv;

  auto fd = nn_socket(AF_SP, NN_SUB);
  if (fd < 0) {
    std::stringstream ss;
    ss << "nn_socket: " << nn_strerror(nn_errno());
    throw std::runtime_error(ss.str());
  }

  const char* url = config.nanomsg.connect.c_str();
  rv = nn_connect(fd, url);
  if (rv < 0) {
    nn_close(fd);
    std::stringstream ss;
    ss << "nn_connect: " << nn_strerror(nn_errno());
    ss << " (" << url << ")";
    throw std::runtime_error(ss.str());
  }

  int size = config.nanomsg.receiveBuffer;
  if (size > 0) {
    rv = nn_setsockopt(fd, NN_SOL_SOCKET, NN_SNDBUF, &size, sizeof(size));
    if (rv < 0) {
      nn_close(fd);
      std::stringstream ss;
      ss << "nn_setsockopt: " << nn_strerror(nn_errno());
      throw std::runtime_error(ss.str());
    }
  }

  rv = nn_setsockopt(fd, NN_SUB, NN_SUB_SUBSCRIBE, "", 0);
  if (rv < 0) {
    nn_close(fd);
    std::stringstream ss;
    ss << "nn_setsockopt: " << nn_strerror(nn_errno());
    ss << " (" << url << ")";
    throw std::runtime_error(ss.str());
  }

  return std::make_unique<Nanomsg>(fd);
}